

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemFMOD::SetMasterVolume(SoundSystemFMOD *this,float volMaster)

{
  FMOD_RESULT _r;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  FmodError local_68;
  
  gFmodRes = FMOD_ChannelGroup_SetVolume(this->pChnGrp);
  if (gFmodRes != FMOD_OK) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"FMOD_ChannelGroup_SetVolume(pChnGrp, volMaster)",&local_c9);
    _r = gFmodRes;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
               ,&local_ca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"SetMasterVolume",&local_cb);
    FmodError::FmodError(&local_68,&local_88,_r,&local_a8,0x1c8,&local_c8);
    FmodError::LogErr(&local_68);
    FmodError::~FmodError(&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetMasterVolume (float volMaster)
{
    FMOD_LOG(FMOD_ChannelGroup_SetVolume(pChnGrp, volMaster));
}